

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> * __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *a)

{
  size_t sVar1;
  size_t __n;
  
  setSize(this,a->width,a->height,(long)a->depth);
  sVar1 = this->n;
  __n = -sVar1;
  if (0 < (long)sVar1) {
    __n = sVar1;
  }
  memcpy(this->pixel,a->pixel,__n);
  return this;
}

Assistant:

Image<T> &operator=(const Image<T> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      memcpy(pixel, a.pixel, std::abs(n)*sizeof(T));

      return *this;
    }